

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_functionBytecodeAssemblerVectorOperand_create
          (sysbvm_context_t *context,sysbvm_operandVectorName_t vectorName,int16_t vectorIndex)

{
  sysbvm_object_tuple_t *psVar1;
  undefined6 in_register_00000012;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionBytecodeAssemblerVectorOperand,0xb);
  psVar1[1].header.field_0.typePointer = (long)(short)vectorName << 4 | 7;
  (psVar1->field_1).pointers[0] = (long)(int)CONCAT62(in_register_00000012,vectorIndex) << 4 | 7;
  psVar1[1].header.identityHashAndFlags = 0xf;
  psVar1[1].header.objectSize = 0;
  psVar1[1].field_1.pointers[0] = 0xf;
  psVar1[2].header.field_0.typePointer = 0xf;
  psVar1[2].header.identityHashAndFlags = 0xf;
  psVar1[2].header.objectSize = 0;
  psVar1[2].field_1.pointers[0] = 0xf;
  psVar1[3].header.field_0.typePointer = 0xf;
  psVar1[3].header.identityHashAndFlags = 0xf;
  psVar1[3].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssemblerVectorOperand_create(sysbvm_context_t *context, sysbvm_operandVectorName_t vectorName, int16_t vectorIndex)
{
    sysbvm_functionBytecodeAssemblerVectorOperand_t *result = (sysbvm_functionBytecodeAssemblerVectorOperand_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionBytecodeAssemblerVectorOperand, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionBytecodeAssemblerVectorOperand_t));
    result->vectorType = sysbvm_tuple_int16_encode(vectorName);
    result->index = sysbvm_tuple_int16_encode(vectorIndex);
    result->hasAllocaDestination = SYSBVM_FALSE_TUPLE;
    result->hasNonAllocaDestination = SYSBVM_FALSE_TUPLE;
    result->hasSlotReferenceAtDestination = SYSBVM_FALSE_TUPLE;
    result->hasNonSlotReferenceAtDestination = SYSBVM_FALSE_TUPLE;
    result->hasLoadStoreUsage = SYSBVM_FALSE_TUPLE;
    result->hasNonLoadStoreUsage = SYSBVM_FALSE_TUPLE;
    result->allocaPointerRankIsLowered = SYSBVM_FALSE_TUPLE;
    return (sysbvm_tuple_t)result;
}